

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeccakP-1600-opt64.c
# Opt level: O1

void KeccakP1600_AddBytesInLane(void *state,uint lanePosition,uchar *data,uint offset,uint length)

{
  ulong *puVar1;
  uint64_t lane;
  ulong local_20;
  
  if (length != 0) {
    if (length == 1) {
      local_20 = (ulong)*data;
    }
    else {
      local_20 = 0;
      memcpy(&local_20,data,(ulong)length);
    }
    puVar1 = (ulong *)((long)state + (ulong)lanePosition * 8);
    *puVar1 = *puVar1 ^ local_20 << ((ulong)(offset << 3) & 0x3f);
  }
  return;
}

Assistant:

void KeccakP1600_AddBytesInLane(void *state, unsigned int lanePosition, const unsigned char *data, unsigned int offset, unsigned int length)
{
#if (PLATFORM_BYTE_ORDER == IS_LITTLE_ENDIAN)
    uint64_t lane;
    if (length == 0)
        return;
    if (length == 1)
        lane = data[0];
    else {
        lane = 0;
        memcpy(&lane, data, length);
    }
    lane <<= offset*8;
#else
    uint64_t lane = 0;
    unsigned int i;
    for(i=0; i<length; i++)
        lane |= ((uint64_t)data[i]) << ((i+offset)*8);
#endif
    ((uint64_t*)state)[lanePosition] ^= lane;
}